

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase237::run(TestCase237 *this)

{
  Reader brand;
  undefined1 auVar1 [40];
  Reader brand_00;
  Reader brand_01;
  Reader brand_02;
  Schema *pSVar2;
  Schema *pSVar3;
  Schema SVar4;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition;
  Fault f;
  Array<capnp::Schema> list;
  uint local_114;
  SchemaLoader loader;
  size_t local_28;
  
  SchemaLoader::SchemaLoader(&loader);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestAllTypes>(&loader);
  SchemaLoader::getAllLoaded(&list,&loader);
  pSVar2 = list.ptr;
  _kjCondition.left = 2;
  _kjCondition.right = list.size_;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = list.size_ == 2;
  if (_kjCondition.result) {
    auVar1 = ZEXT1640(ZEXT816(0));
    brand._reader._40_8_ = 0x7fffffff;
    brand._reader.segment = (SegmentReader *)auVar1._0_8_;
    brand._reader.capTable = (CapTableReader *)auVar1._8_8_;
    brand._reader.data = (void *)auVar1._16_8_;
    brand._reader.pointers = (WirePointer *)auVar1._24_8_;
    brand._reader.dataSize = auVar1._32_4_;
    brand._reader.pointerCount = auVar1._36_2_;
    brand._reader._38_2_ = auVar1._38_2_;
    SVar4 = SchemaLoader::get(&loader,0xa0a8f314b80b63fd,brand,(Schema)0x669c88);
    pSVar3 = list.ptr;
    if (pSVar2->raw == SVar4.raw) {
      auVar1 = ZEXT1640(ZEXT816(0));
      brand_02._reader._40_8_ = 0x7fffffff;
      brand_02._reader.segment = (SegmentReader *)auVar1._0_8_;
      brand_02._reader.capTable = (CapTableReader *)auVar1._8_8_;
      brand_02._reader.data = (void *)auVar1._16_8_;
      brand_02._reader.pointers = (WirePointer *)auVar1._24_8_;
      brand_02._reader.dataSize = auVar1._32_4_;
      brand_02._reader.pointerCount = auVar1._36_2_;
      brand_02._reader._38_2_ = auVar1._38_2_;
      _kjCondition.right =
           (unsigned_long)SchemaLoader::get(&loader,0x9c8e9318b29d9cd3,brand_02,(Schema)0x669c88);
      _kjCondition.result = list.ptr[1].raw == (RawBrandedSchema *)_kjCondition.right;
      _kjCondition._0_8_ = list.ptr + 1;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                   ,0xf4,ERROR,
                   "\"failed: expected \" \"list[1] == loader.get(typeId<TestEnum>())\", _kjCondition"
                   ,(char (*) [59])"failed: expected list[1] == loader.get(typeId<TestEnum>())",
                   (DebugComparison<capnp::Schema_&,_capnp::Schema> *)&_kjCondition);
      }
    }
    else {
      auVar1 = ZEXT1640(ZEXT816(0));
      brand_00._reader._40_8_ = 0x7fffffff;
      brand_00._reader.segment = (SegmentReader *)auVar1._0_8_;
      brand_00._reader.capTable = (CapTableReader *)auVar1._8_8_;
      brand_00._reader.data = (void *)auVar1._16_8_;
      brand_00._reader.pointers = (WirePointer *)auVar1._24_8_;
      brand_00._reader.dataSize = auVar1._32_4_;
      brand_00._reader.pointerCount = auVar1._36_2_;
      brand_00._reader._38_2_ = auVar1._38_2_;
      _kjCondition.right =
           (unsigned_long)SchemaLoader::get(&loader,0x9c8e9318b29d9cd3,brand_00,(Schema)0x669c88);
      _kjCondition.result = pSVar3->raw == (RawBrandedSchema *)_kjCondition.right;
      _kjCondition._0_8_ = pSVar3;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[59],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                   ,0xf6,ERROR,
                   "\"failed: expected \" \"list[0] == loader.get(typeId<TestEnum>())\", _kjCondition"
                   ,(char (*) [59])"failed: expected list[0] == loader.get(typeId<TestEnum>())",
                   (DebugComparison<capnp::Schema_&,_capnp::Schema> *)&_kjCondition);
      }
      auVar1 = ZEXT1640(ZEXT816(0));
      brand_01._reader._40_8_ = 0x7fffffff;
      brand_01._reader.segment = (SegmentReader *)auVar1._0_8_;
      brand_01._reader.capTable = (CapTableReader *)auVar1._8_8_;
      brand_01._reader.data = (void *)auVar1._16_8_;
      brand_01._reader.pointers = (WirePointer *)auVar1._24_8_;
      brand_01._reader.dataSize = auVar1._32_4_;
      brand_01._reader.pointerCount = auVar1._36_2_;
      brand_01._reader._38_2_ = auVar1._38_2_;
      _kjCondition.right =
           (unsigned_long)SchemaLoader::get(&loader,0xa0a8f314b80b63fd,brand_01,(Schema)0x669c88);
      _kjCondition.result = list.ptr[1].raw == (RawBrandedSchema *)_kjCondition.right;
      _kjCondition._0_8_ = list.ptr + 1;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[63],kj::_::DebugComparison<capnp::Schema&,capnp::Schema>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                   ,0xf7,ERROR,
                   "\"failed: expected \" \"list[1] == loader.get(typeId<TestAllTypes>())\", _kjCondition"
                   ,(char (*) [63])"failed: expected list[1] == loader.get(typeId<TestAllTypes>())",
                   (DebugComparison<capnp::Schema_&,_capnp::Schema> *)&_kjCondition);
      }
    }
    kj::Array<capnp::Schema>::~Array(&list);
    SchemaLoader::~SchemaLoader(&loader);
    return;
  }
  local_114 = 2;
  local_28 = list.size_;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
             ,0xf2,FAILED,"(2u) == (list.size())","_kjCondition,2u, list.size()",&_kjCondition,
             &local_114,&local_28);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(SchemaLoader, Enumerate) {
  SchemaLoader loader;
  loader.loadCompiledTypeAndDependencies<TestAllTypes>();
  auto list = loader.getAllLoaded();

  ASSERT_EQ(2u, list.size());
  if (list[0] == loader.get(typeId<TestAllTypes>())) {
    EXPECT_TRUE(list[1] == loader.get(typeId<TestEnum>()));
  } else {
    EXPECT_TRUE(list[0] == loader.get(typeId<TestEnum>()));
    EXPECT_TRUE(list[1] == loader.get(typeId<TestAllTypes>()));
  }
}